

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::AddRawTransactionRequest::ConvertFromStruct
          (AddRawTransactionRequest *this,AddRawTransactionRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->tx_);
  core::JsonObjectVector<cfd::js::api::json::TxInRequest,_cfd::js::api::TxInRequestStruct>::
  ConvertFromStruct(&this->txins_,&data->txins);
  core::JsonObjectVector<cfd::js::api::json::TxOutRequest,_cfd::js::api::TxOutRequestStruct>::
  ConvertFromStruct(&this->txouts_,&data->txouts);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void AddRawTransactionRequest::ConvertFromStruct(
    const AddRawTransactionRequestStruct& data) {
  tx_ = data.tx;
  txins_.ConvertFromStruct(data.txins);
  txouts_.ConvertFromStruct(data.txouts);
  ignore_items = data.ignore_items;
}